

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaExist.c
# Opt level: O1

int Gia_ManQuantCountUsed_rec(Gia_Man_t *p,int iObj)

{
  Gia_Obj_t *pGVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  
  uVar7 = (ulong)(uint)iObj;
  iVar5 = 0;
  while( true ) {
    iVar6 = (int)uVar7;
    if (p->nTravIdsAlloc <= iVar6) {
      __assert_fail("Id < p->nTravIdsAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x268,"int Gia_ObjIsTravIdCurrentId(Gia_Man_t *, int)");
    }
    iVar3 = 0;
    if (p->pTravIds[iVar6] == p->nTravIds) break;
    p->pTravIds[iVar6] = p->nTravIds;
    if ((iVar6 < 0) || (p->nObjs <= iVar6)) {
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    uVar2 = (uint)*(undefined8 *)(p->pObjs + uVar7);
    if ((~uVar2 & 0x9fffffff) == 0) break;
    pGVar1 = p->pObjs + uVar7;
    iVar3 = Gia_ManQuantCheckSupp(p,iVar6 - (uVar2 & 0x1fffffff),p->iSuppPi);
    if (iVar3 == 0) {
      iVar3 = 1;
    }
    else {
      iVar3 = Gia_ManQuantCountUsed_rec(p,iVar6 - (*(uint *)pGVar1 & 0x1fffffff));
      iVar3 = iVar3 + 1;
    }
    iVar4 = Gia_ManQuantCheckSupp(p,iVar6 - (*(uint *)&pGVar1->field_0x4 & 0x1fffffff),p->iSuppPi);
    if (iVar4 == 0) break;
    uVar7 = (ulong)(iVar6 - (*(uint *)&pGVar1->field_0x4 & 0x1fffffff));
    iVar5 = iVar5 + iVar3;
  }
  return iVar5 + iVar3;
}

Assistant:

int Gia_ManQuantCountUsed_rec( Gia_Man_t * p, int iObj )
{
    Gia_Obj_t * pObj; int Count = 1;
    if ( Gia_ObjIsTravIdCurrentId( p, iObj ) )
        return 0;
    Gia_ObjSetTravIdCurrentId( p, iObj );
    pObj = Gia_ManObj( p, iObj );
    if ( Gia_ObjIsCi(pObj) )
        return 0;
    if ( Gia_ManQuantCheckSupp(p, Gia_ObjFaninId0(pObj, iObj), p->iSuppPi) )
        Count += Gia_ManQuantCountUsed_rec( p, Gia_ObjFaninId0(pObj, iObj) );
    if ( Gia_ManQuantCheckSupp(p, Gia_ObjFaninId1(pObj, iObj), p->iSuppPi) )
        Count += Gia_ManQuantCountUsed_rec( p, Gia_ObjFaninId1(pObj, iObj) );
    return Count;
}